

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O0

void AVSInterface::RegisterFilter<LegacyMiniDeen>(IScriptEnvironment *env)

{
  _func_void_uint8_t_ptr_uint8_t_ptr_int_int_int_int_uint_int *p_Var1;
  char *pcVar2;
  undefined8 uVar3;
  string local_e0;
  undefined1 local_c0 [8];
  LegacyMiniDeen filter;
  IScriptEnvironment *env_local;
  
  filter.super_MiniDeen.minideen_core =
       (_func_void_uint8_t_ptr_uint8_t_ptr_int_int_int_int_uint_int *)env;
  LegacyMiniDeen::LegacyMiniDeen((LegacyMiniDeen *)local_c0);
  p_Var1 = filter.super_MiniDeen.minideen_core;
  pcVar2 = LegacyMiniDeen::AVSName((LegacyMiniDeen *)local_c0);
  Filter::AVSParams_abi_cxx11_(&local_e0,(Filter *)local_c0);
  uVar3 = std::__cxx11::string::c_str();
  (**(code **)(*(long *)p_Var1 + 0x38))(p_Var1,pcVar2,uVar3,Create<LegacyMiniDeen>,0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void RegisterFilter(IScriptEnvironment* env) {
    FilterType filter;
    env->AddFunction(filter.AVSName(), filter.AVSParams().c_str(), Create<FilterType>, nullptr);
  }